

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

SigHashType __thiscall
cfd::core::SigHashType::Create
          (SigHashType *this,uint8_t flag,bool is_append_anyone_can_pay,bool is_append_fork_id)

{
  undefined3 in_register_00000011;
  undefined4 extraout_EDX;
  SigHashType SVar1;
  
  this->kSigHashForkId = '@';
  this->kSigHashRangeproof = '@';
  this->kSigHashAnyOneCanPay = 0x80;
  this->hash_algorithm_ = kSigHashAll;
  this->is_anyone_can_pay_ = false;
  this->is_fork_id_ = false;
  SetFromSigHashFlag(this,flag);
  if (CONCAT31(in_register_00000011,is_append_anyone_can_pay) != 0) {
    this->is_anyone_can_pay_ = true;
  }
  if (is_append_fork_id) {
    this->is_fork_id_ = true;
  }
  SVar1.is_anyone_can_pay_ = (bool)(char)extraout_EDX;
  SVar1.is_fork_id_ = (bool)(char)((uint)extraout_EDX >> 8);
  SVar1._10_2_ = (short)((uint)extraout_EDX >> 0x10);
  SVar1._0_8_ = this;
  return SVar1;
}

Assistant:

SigHashType SigHashType::Create(
    uint8_t flag, bool is_append_anyone_can_pay, bool is_append_fork_id) {
  SigHashType obj;
  obj.SetFromSigHashFlag(flag);
  if (is_append_anyone_can_pay) obj.is_anyone_can_pay_ = true;
  if (is_append_fork_id) obj.is_fork_id_ = true;
  return obj;
}